

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

KeyInfo * sqlite3KeyInfoOfIndex(Parse *pParse,Index *pIdx)

{
  KeyInfo *p;
  CollSeq *pCVar1;
  int X;
  uint uVar2;
  uint N;
  ulong uVar3;
  
  if (pParse->nErr == 0) {
    uVar2 = (uint)pIdx->nColumn;
    if ((pIdx->field_0x63 & 8) == 0) {
      X = 0;
      N = uVar2;
    }
    else {
      N = (uint)pIdx->nKeyCol;
      X = uVar2 - N;
    }
    p = sqlite3KeyInfoAlloc(pParse->db,N,X);
    if (p != (KeyInfo *)0x0) {
      if (uVar2 != 0) {
        uVar3 = 0;
        do {
          if (pIdx->azColl[uVar3] == "BINARY") {
            pCVar1 = (CollSeq *)0x0;
          }
          else {
            pCVar1 = sqlite3LocateCollSeq(pParse,pIdx->azColl[uVar3]);
          }
          p->aColl[uVar3] = pCVar1;
          p->aSortFlags[uVar3] = pIdx->aSortOrder[uVar3];
          uVar3 = uVar3 + 1;
        } while (uVar2 != uVar3);
      }
      if (pParse->nErr == 0) {
        return p;
      }
      if ((*(ushort *)&pIdx->field_0x63 >> 9 & 1) == 0) {
        *(ushort *)&pIdx->field_0x63 = *(ushort *)&pIdx->field_0x63 | 0x200;
        pParse->rc = 0x201;
      }
      p->nRef = p->nRef - 1;
      if (p->nRef == 0) {
        sqlite3DbNNFreeNN(p->db,p);
      }
    }
  }
  return (KeyInfo *)0x0;
}

Assistant:

SQLITE_PRIVATE KeyInfo *sqlite3KeyInfoOfIndex(Parse *pParse, Index *pIdx){
  int i;
  int nCol = pIdx->nColumn;
  int nKey = pIdx->nKeyCol;
  KeyInfo *pKey;
  if( pParse->nErr ) return 0;
  if( pIdx->uniqNotNull ){
    pKey = sqlite3KeyInfoAlloc(pParse->db, nKey, nCol-nKey);
  }else{
    pKey = sqlite3KeyInfoAlloc(pParse->db, nCol, 0);
  }
  if( pKey ){
    assert( sqlite3KeyInfoIsWriteable(pKey) );
    for(i=0; i<nCol; i++){
      const char *zColl = pIdx->azColl[i];
      pKey->aColl[i] = zColl==sqlite3StrBINARY ? 0 :
                        sqlite3LocateCollSeq(pParse, zColl);
      pKey->aSortFlags[i] = pIdx->aSortOrder[i];
      assert( 0==(pKey->aSortFlags[i] & KEYINFO_ORDER_BIGNULL) );
    }
    if( pParse->nErr ){
      assert( pParse->rc==SQLITE_ERROR_MISSING_COLLSEQ );
      if( pIdx->bNoQuery==0 ){
        /* Deactivate the index because it contains an unknown collating
        ** sequence.  The only way to reactive the index is to reload the
        ** schema.  Adding the missing collating sequence later does not
        ** reactive the index.  The application had the chance to register
        ** the missing index using the collation-needed callback.  For
        ** simplicity, SQLite will not give the application a second chance.
        */
        pIdx->bNoQuery = 1;
        pParse->rc = SQLITE_ERROR_RETRY;
      }
      sqlite3KeyInfoUnref(pKey);
      pKey = 0;
    }
  }
  return pKey;
}